

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O3

void __thiscall UnitTests::Assert::True(Assert *this,string *msg,bool expr)

{
  undefined7 in_register_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if ((int)CONCAT71(in_register_00000011,expr) != 0) {
    return;
  }
  std::operator+(&local_30,msg," Expression evaluated to false");
  Error(this,&local_30);
}

Assistant:

void True(const std::string& msg, bool expr) const
        {
            if (!expr)
            {
                Error(msg + " Expression evaluated to false");
            }
        }